

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollLocation location,bool active)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QRect *pQVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ScrollLocation location_00;
  QAction *action;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = popupGeometry(this,(QScreen *)0x0);
  updateActionRects(this,&local_40);
  if (location == ScrollBottom) {
    uVar5 = (int)(this->super_QWidgetPrivate).actions.d.size - 1;
    if (-1 < (int)uVar5) {
      lVar10 = (ulong)uVar5 << 4;
      lVar9 = (ulong)uVar5 + 1;
      do {
        pQVar3 = (this->actionRects).d.ptr;
        uVar1 = *(undefined8 *)((long)&(pQVar3->x1).m_i + lVar10);
        uVar2 = *(undefined8 *)((long)&(pQVar3->x2).m_i + lVar10);
        iVar13 = -(uint)((int)uVar2 == (int)uVar1 + -1);
        iVar14 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20) + -1);
        auVar12._4_4_ = iVar13;
        auVar12._0_4_ = iVar13;
        auVar12._8_4_ = iVar14;
        auVar12._12_4_ = iVar14;
        iVar13 = movmskpd((int)pQVar3,auVar12);
        if (iVar13 != 3) {
          action = (this->super_QWidgetPrivate).actions.d.ptr[lVar9 + -1];
          bVar4 = considerAction(this,action);
          if (bVar4) {
            if ((this->scroll->scrollFlags & 2) == 0) goto LAB_004584d4;
            if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00458557;
            location_00 = ScrollBottom;
            goto LAB_00458546;
          }
        }
        lVar10 = lVar10 + -0x10;
        lVar8 = lVar9 + -1;
        bVar4 = 0 < lVar9;
        lVar9 = lVar8;
      } while (lVar8 != 0 && bVar4);
    }
  }
  else if ((location == ScrollTop) &&
          (uVar6 = (this->super_QWidgetPrivate).actions.d.size, uVar6 != 0)) {
    lVar9 = 8;
    uVar7 = 0;
    do {
      pQVar3 = (this->actionRects).d.ptr;
      uVar1 = *(undefined8 *)((long)pQVar3 + lVar9 + -8);
      uVar2 = *(undefined8 *)((long)&(pQVar3->x1).m_i + lVar9);
      iVar13 = -(uint)((int)uVar2 == (int)uVar1 + -1);
      iVar14 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20) + -1);
      auVar11._4_4_ = iVar13;
      auVar11._0_4_ = iVar13;
      auVar11._8_4_ = iVar14;
      auVar11._12_4_ = iVar14;
      iVar13 = movmskpd((int)pQVar3,auVar11);
      if (iVar13 != 3) {
        action = (this->super_QWidgetPrivate).actions.d.ptr[uVar7];
        bVar4 = considerAction(this,action);
        if (bVar4) {
          if ((this->scroll->scrollFlags & 1) == 0) goto LAB_004584d4;
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            location_00 = ScrollTop;
LAB_00458546:
            scrollMenu(this,action,location_00,active);
            return;
          }
          goto LAB_00458557;
        }
        uVar6 = (this->super_QWidgetPrivate).actions.d.size;
      }
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar7 < uVar6);
  }
LAB_0045850a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00458557:
  __stack_chk_fail();
LAB_004584d4:
  if (active) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setCurrentAction(this,action,-1,SelectedFromKeyboard,false);
      return;
    }
    goto LAB_00458557;
  }
  goto LAB_0045850a;
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollLocation location, bool active)
{
    updateActionRects();
    if (location == QMenuScroller::ScrollBottom) {
        for(int i = actions.size()-1; i >= 0; --i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollBottom, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    } else if (location == QMenuScroller::ScrollTop) {
        for(int i = 0; i < actions.size(); ++i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollTop, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    }
}